

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOFX_eq.c
# Opt level: O2

uint32_t FAPOFXCreateEQ(FAPO **pEffect,void *pInitData,uint32_t InitDataByteSize,
                       FAudioMallocFunc customMalloc,FAudioFreeFunc customFree,
                       FAudioReallocFunc customRealloc,uint8_t legacy)

{
  FAPOBase *fapo;
  uint8_t *pParameterBlocks;
  ulong uVar1;
  FAPORegistrationProperties *pRegistrationProperties;
  uint8_t *puVar2;
  FAPOFXEQParameters fxdefault;
  
  fxdefault.Bandwidth2 = 1.0;
  fxdefault.FrequencyCenter3 = 10000.0;
  fxdefault.Gain3 = 1.0;
  fxdefault.Bandwidth3 = 1.0;
  fxdefault.Gain1 = 1.0;
  fxdefault.Bandwidth1 = 1.0;
  fxdefault.FrequencyCenter2 = 2000.0;
  fxdefault.Gain2 = 1.0;
  fxdefault.FrequencyCenter0 = 100.0;
  fxdefault.Gain0 = 1.0;
  fxdefault.Bandwidth0 = 1.0;
  fxdefault.FrequencyCenter1 = 800.0;
  fapo = (FAPOBase *)(*customMalloc)(0xe0);
  pParameterBlocks = (uint8_t *)(*customMalloc)(0x90);
  if (pInitData == (void *)0x0) {
    SDL_memset(pParameterBlocks,0,0x90);
    pInitData = &fxdefault;
    uVar1 = 0x30;
    SDL_memcpy(pParameterBlocks,pInitData,0x30);
    SDL_memcpy(pParameterBlocks + 0x30,pInitData,0x30);
    puVar2 = pParameterBlocks + 0x60;
  }
  else {
    uVar1 = (ulong)InitDataByteSize;
    SDL_memcpy(pParameterBlocks,pInitData,uVar1);
    SDL_memcpy(pParameterBlocks + uVar1,pInitData,uVar1);
    puVar2 = pParameterBlocks + InitDataByteSize * 2;
  }
  SDL_memcpy(puVar2,pInitData,uVar1);
  pRegistrationProperties = &FXEQProperties_LEGACY;
  SDL_memcpy(&FXEQProperties_LEGACY,&FAPOFX_CLSID_FXEQ_LEGACY,0x10);
  SDL_memcpy(&FXEQProperties,&FAPOFX_CLSID_FXEQ,0x10);
  if (legacy == '\0') {
    pRegistrationProperties = &FXEQProperties;
  }
  CreateFAPOBaseWithCustomAllocatorEXT
            (fapo,pRegistrationProperties,pParameterBlocks,0x30,'\0',customMalloc,customFree,
             customRealloc);
  (fapo->base).Initialize = FAPOFXEQ_Initialize;
  (fapo->base).Process = FAPOFXEQ_Process;
  fapo->Destructor = FAPOFXEQ_Free;
  *pEffect = (FAPO *)fapo;
  return 0;
}

Assistant:

uint32_t FAPOFXCreateEQ(
	FAPO **pEffect,
	const void *pInitData,
	uint32_t InitDataByteSize,
	FAudioMallocFunc customMalloc,
	FAudioFreeFunc customFree,
	FAudioReallocFunc customRealloc,
	uint8_t legacy
) {
	const FAPOFXEQParameters fxdefault =
	{
		FAPOFXEQ_DEFAULT_FREQUENCY_CENTER_0,
		FAPOFXEQ_DEFAULT_GAIN,
		FAPOFXEQ_DEFAULT_BANDWIDTH,
		FAPOFXEQ_DEFAULT_FREQUENCY_CENTER_1,
		FAPOFXEQ_DEFAULT_GAIN,
		FAPOFXEQ_DEFAULT_BANDWIDTH,
		FAPOFXEQ_DEFAULT_FREQUENCY_CENTER_2,
		FAPOFXEQ_DEFAULT_GAIN,
		FAPOFXEQ_DEFAULT_BANDWIDTH,
		FAPOFXEQ_DEFAULT_FREQUENCY_CENTER_3,
		FAPOFXEQ_DEFAULT_GAIN,
		FAPOFXEQ_DEFAULT_BANDWIDTH
	};

	/* Allocate... */
	FAPOFXEQ *result = (FAPOFXEQ*) customMalloc(
		sizeof(FAPOFXEQ)
	);
	uint8_t *params = (uint8_t*) customMalloc(
		sizeof(FAPOFXEQParameters) * 3
	);
	if (pInitData == NULL)
	{
		FAudio_zero(params, sizeof(FAPOFXEQParameters) * 3);
		#define INITPARAMS(offset) \
			FAudio_memcpy( \
				params + sizeof(FAPOFXEQParameters) * offset, \
				&fxdefault, \
				sizeof(FAPOFXEQParameters) \
			);
		INITPARAMS(0)
		INITPARAMS(1)
		INITPARAMS(2)
		#undef INITPARAMS
	}
	else
	{
		FAudio_assert(InitDataByteSize == sizeof(FAPOFXEQParameters));
		FAudio_memcpy(params, pInitData, InitDataByteSize);
		FAudio_memcpy(params + InitDataByteSize, pInitData, InitDataByteSize);
		FAudio_memcpy(params + (InitDataByteSize * 2), pInitData, InitDataByteSize);
	}

	/* Initialize... */
	FAudio_memcpy(
		&FXEQProperties_LEGACY.clsid,
		&FAPOFX_CLSID_FXEQ_LEGACY,
		sizeof(FAudioGUID)
	);
	FAudio_memcpy(
		&FXEQProperties.clsid,
		&FAPOFX_CLSID_FXEQ,
		sizeof(FAudioGUID)
	);
	CreateFAPOBaseWithCustomAllocatorEXT(
		&result->base,
		legacy ? &FXEQProperties_LEGACY : &FXEQProperties,
		params,
		sizeof(FAPOFXEQParameters),
		0,
		customMalloc,
		customFree,
		customRealloc
	);

	/* Function table... */
	result->base.base.Initialize = (InitializeFunc)
		FAPOFXEQ_Initialize;
	result->base.base.Process = (ProcessFunc)
		FAPOFXEQ_Process;
	result->base.Destructor = FAPOFXEQ_Free;

	/* Finally. */
	*pEffect = &result->base.base;
	return 0;
}